

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void SerializeObject(CJSON *json)

{
  File *pFVar1;
  ostream *poVar2;
  allocator<char> local_191;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  Folder dir;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Test",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/home/test",&local_191);
  Folder::Folder(&dir,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  pFVar1 = (File *)operator_new(0x48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Test.png",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"/home/test/Test",&local_191);
  File::File(pFVar1,&local_d0,&local_f0,0x800);
  Folder::AddFile(&dir,pFVar1);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  pFVar1 = (File *)operator_new(0x48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Test.txt",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"/home/test/Test",&local_191);
  File::File(pFVar1,&local_110,&local_130,0x200);
  Folder::AddFile(&dir,pFVar1);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  pFVar1 = (File *)operator_new(0x48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Test.mp3",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"/home/test/Test",&local_191);
  File::File(pFVar1,&local_150,&local_170,10000000);
  Folder::AddFile(&dir,pFVar1);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  poVar2 = std::operator<<((ostream *)&std::cout,"Folder: ");
  CJSON::Serialize<Folder,_nullptr>(&local_190,json,&dir);
  poVar2 = std::operator<<(poVar2,(string *)&local_190);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_190);
  Folder::~Folder(&dir);
  return;
}

Assistant:

void SerializeObject(CJSON &json)
{
    Folder dir("Test", "/home/test");
    dir.AddFile(new File("Test.png", "/home/test/Test", 2048));
    dir.AddFile(new File("Test.txt", "/home/test/Test", 512));
    dir.AddFile(new File("Test.mp3", "/home/test/Test", 10000000));

    cout << "Folder: " << json.Serialize(dir) << endl;
}